

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O3

void __thiscall
BMRS_XZ<UF>::FindRuns
          (BMRS_XZ<UF> *this,uint64_t *bits_start,uint64_t *bits_flag,int height,int data_width,
          Run *runs)

{
  ulong *puVar1;
  ulong *puVar2;
  uint64_t *flag_bits;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Run *pRVar8;
  uint *puVar9;
  uint uVar10;
  uint64_t uVar11;
  long lVar12;
  ushort uVar13;
  Run *pRVar14;
  ulong *puVar16;
  ushort uVar17;
  unsigned_short uVar18;
  short sVar19;
  uint uVar20;
  ulong uVar21;
  Run *pRVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  Run *pRVar15;
  
  puVar9 = UF::P_;
  lVar12 = (long)data_width;
  uVar21 = *bits_start;
  sVar19 = 0;
  puVar16 = bits_start;
  pRVar14 = runs;
  while( true ) {
    for (; uVar21 != 0; uVar21 = (~uVar21 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f)) {
      lVar5 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      pRVar14->start_pos = (short)lVar5 + sVar19;
      uVar21 = (~uVar21 >> ((byte)lVar5 & 0x3f)) << ((byte)lVar5 & 0x3f);
      if (uVar21 == 0) {
        do {
          sVar19 = sVar19 + 0x40;
          puVar1 = puVar16 + 1;
          puVar16 = puVar16 + 1;
        } while (*puVar1 == 0xffffffffffffffff);
        uVar21 = ~*puVar1;
      }
      lVar5 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
        }
      }
      pRVar14->end_pos = (short)lVar5 + sVar19;
      puVar9[UF::length_] = UF::length_;
      uVar10 = UF::length_ + 1;
      pRVar14->label = UF::length_;
      UF::length_ = uVar10;
      pRVar14 = pRVar14 + 1;
    }
    puVar16 = puVar16 + 1;
    if (puVar16 == bits_start + lVar12) break;
    sVar19 = sVar19 + 0x40;
    uVar21 = *puVar16;
  }
  pRVar14->start_pos = 0xffff;
  pRVar14->end_pos = 0xffff;
  if (height < 2) {
LAB_002442e9:
    puVar9 = UF::P_;
    uVar10 = 1;
    if (1 < UF::length_) {
      uVar10 = 1;
      uVar21 = 1;
      do {
        if (puVar9[uVar21] < uVar21) {
          uVar20 = puVar9[puVar9[uVar21]];
        }
        else {
          uVar20 = uVar10;
          uVar10 = uVar10 + 1;
        }
        puVar9[uVar21] = uVar20;
        uVar21 = uVar21 + 1;
      } while (uVar21 < UF::length_);
    }
    (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
    return;
  }
  uVar21 = 1;
LAB_00243f63:
  pRVar15 = pRVar14 + 1;
  flag_bits = bits_flag + (uVar21 - 1) * lVar12;
  puVar16 = bits_start + uVar21 * lVar12;
  puVar1 = puVar16 + lVar12;
  uVar23 = *puVar16;
  lVar5 = 0;
  pRVar14 = pRVar15;
  do {
    for (; uVar23 != 0; uVar23 = ~uVar23 & -1L << ((byte)lVar7 & 0x3f)) {
      lVar6 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar23 = (~uVar23 >> ((byte)lVar6 & 0x3f)) << ((byte)lVar6 & 0x3f);
      lVar26 = lVar5;
      if (uVar23 == 0) {
        do {
          lVar26 = lVar26 + 0x40;
          puVar2 = puVar16 + 1;
          puVar16 = puVar16 + 1;
        } while (*puVar2 == 0xffffffffffffffff);
        uVar23 = ~*puVar2;
      }
      lVar7 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
        }
      }
      uVar17 = (ushort)(lVar5 + lVar6);
      uVar10 = (uint)(lVar5 + lVar6) & 0xffff;
      pRVar22 = runs;
      do {
        runs = pRVar22;
        uVar3 = runs->end_pos;
        pRVar22 = runs + 1;
      } while (uVar3 < uVar10);
      uVar13 = runs->start_pos;
      uVar18 = (unsigned_short)(lVar7 + lVar26);
      uVar20 = (uint)(lVar7 + lVar26) & 0xffff;
      if (uVar20 < uVar13) {
        pRVar14->start_pos = uVar17;
        pRVar14->end_pos = uVar18;
        UF::P_[UF::length_] = UF::length_;
        uVar10 = UF::length_ + 1;
        pRVar14->label = UF::length_;
        UF::length_ = uVar10;
      }
      else {
        if (uVar13 <= uVar10) {
          uVar13 = uVar17;
        }
        if (uVar3 < uVar20) {
          uVar11 = is_connected(this,flag_bits,(uint)uVar13,(uint)uVar3);
          if (uVar11 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = UF::P_[runs->label];
          }
          uVar3 = pRVar22->start_pos;
          pRVar8 = runs;
          while (runs = pRVar22, uVar3 <= uVar20) {
            if (uVar20 <= pRVar8[1].end_pos) {
              uVar11 = is_connected(this,flag_bits,(uint)uVar3,uVar20);
              if (((uVar11 != 0) && (uVar20 = UF::P_[pRVar8[1].label], uVar10 != uVar20)) &&
                 (bVar27 = uVar10 != 0, uVar4 = uVar10, uVar10 = uVar20, bVar27)) {
                do {
                  uVar25 = uVar4;
                  uVar4 = UF::P_[uVar25];
                } while (UF::P_[uVar25] < uVar25);
                do {
                  uVar10 = uVar20;
                  uVar20 = UF::P_[uVar10];
                } while (UF::P_[uVar10] < uVar10);
                if (uVar25 < uVar10) {
                  UF::P_[uVar10] = uVar25;
                  uVar10 = uVar25;
                }
                else {
                  UF::P_[uVar25] = uVar10;
                }
              }
              break;
            }
            uVar11 = is_connected(this,flag_bits,(uint)uVar3,(uint)pRVar8[1].end_pos);
            if (((uVar11 != 0) && (uVar4 = UF::P_[pRVar8[1].label], uVar10 != uVar4)) &&
               (bVar27 = uVar10 != 0, uVar25 = uVar10, uVar10 = uVar4, bVar27)) {
              do {
                uVar24 = uVar25;
                uVar25 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              do {
                uVar10 = uVar4;
                uVar4 = UF::P_[uVar10];
              } while (UF::P_[uVar10] < uVar10);
              if (uVar24 < uVar10) {
                UF::P_[uVar10] = uVar24;
                uVar10 = uVar24;
              }
              else {
                UF::P_[uVar24] = uVar10;
              }
            }
            pRVar22 = runs + 1;
            pRVar8 = runs;
            uVar3 = runs[1].start_pos;
          }
          if (uVar10 == 0) {
            UF::P_[UF::length_] = UF::length_;
            uVar10 = UF::length_;
            UF::length_ = UF::length_ + 1;
          }
          pRVar14->label = uVar10;
          pRVar14->start_pos = uVar17;
          pRVar14->end_pos = uVar18;
        }
        else {
          uVar11 = is_connected(this,flag_bits,(uint)uVar13,uVar20);
          if (uVar11 == 0) {
            UF::P_[UF::length_] = UF::length_;
            uVar10 = UF::length_;
            UF::length_ = UF::length_ + 1;
          }
          else {
            uVar10 = UF::P_[runs->label];
          }
          pRVar14->label = uVar10;
          pRVar14->start_pos = uVar17;
          pRVar14->end_pos = uVar18;
        }
      }
      pRVar14 = pRVar14 + 1;
      lVar5 = lVar26;
    }
    puVar16 = puVar16 + 1;
    if (puVar16 == puVar1) break;
    uVar23 = *puVar16;
    lVar5 = lVar5 + 0x40;
  } while( true );
  pRVar14->start_pos = 0xffff;
  pRVar14->end_pos = 0xffff;
  uVar21 = uVar21 + 1;
  runs = pRVar15;
  if (uVar21 == (uint)height) goto LAB_002442e9;
  goto LAB_00243f63;
}

Assistant:

void FindRuns(const uint64_t* bits_start, const uint64_t* bits_flag, int height, int data_width, Run* runs) {
        Run* runs_up = runs;

        //process runs in the first merged row
        const uint64_t* bits = bits_start;
        const uint64_t* bit_final = bits + data_width;
        uint64_t working_bits = *bits;
        unsigned long basepos = 0, bitpos = 0;
        for (;; runs++) {
            //find starting position
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                if (bits == bit_final) {
                    runs->start_pos = (short)0xFFFF;
                    runs->end_pos = (short)0xFFFF;
                    runs++;
                    goto out;
                }
                working_bits = *bits;
            }
            runs->start_pos = short(basepos + bitpos);

            //find ending position
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                bits++, basepos += 64;
                working_bits = ~(*bits);
            }
            working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
            runs->end_pos = short(basepos + bitpos);
            runs->label = LabelsSolver::NewLabel();
        }
        out:

        //process runs in the rests
        for (int row = 1; row < height; row++) {
            Run* runs_save = runs;
            const uint64_t* bits_f = bits_flag + data_width * (row - 1);
            const uint64_t* bits = bits_start + data_width * row;
            const uint64_t* bit_final = bits + data_width;
            uint64_t working_bits = *bits;
            unsigned long basepos = 0, bitpos = 0;

            for (;; runs++) {
                //find starting position
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    if (bits == bit_final) {
                        runs->start_pos = (short)0xFFFF;
                        runs->end_pos = (short)0xFFFF;
                        runs++;
                        goto out2;
                    }
                    working_bits = *bits;
                }
                unsigned short start_pos = short(basepos + bitpos);

                //find ending position
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                while (!YacclabBitScanForward64(&bitpos, working_bits)) {
                    bits++, basepos += 64;
                    working_bits = ~(*bits);
                }
                working_bits = (~working_bits) & (0xFFFFFFFFFFFFFFFF << bitpos);
                unsigned short end_pos = short(basepos + bitpos);

                //Skip upper runs end before this slice starts
                for (; runs_up->end_pos < start_pos; runs_up++);

                //No upper run meets this
                if (runs_up->start_pos > end_pos) {
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    runs->label = LabelsSolver::NewLabel();
                    continue;
                };

                //Next upper run can not meet this
                unsigned short cross_st = (start_pos >= runs_up->start_pos) ? start_pos : runs_up->start_pos;
                if (end_pos <= runs_up->end_pos) {
                    if (is_connected(bits_f, cross_st, end_pos)) runs->label = LabelsSolver::GetLabel(runs_up->label);
                    else runs->label = LabelsSolver::NewLabel();
                    runs->start_pos = start_pos;
                    runs->end_pos = end_pos;
                    continue;
                }

                unsigned label;
                if (is_connected(bits_f, cross_st, runs_up->end_pos)) label = LabelsSolver::GetLabel(runs_up->label);
                else label = 0;
                runs_up++;

                //Find next upper runs meet this
                for (; runs_up->start_pos <= end_pos; runs_up++) {
                    if (end_pos <= runs_up->end_pos) {
                        if (is_connected(bits_f, runs_up->start_pos, end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                        break;
                    }
                    else {
                        if (is_connected(bits_f, runs_up->start_pos, runs_up->end_pos)) {
                            unsigned label_other = LabelsSolver::GetLabel(runs_up->label);
                            if (label != label_other) {
                                label = (label) ? LabelsSolver::Merge(label, label_other) : label_other;
                            }
                        }
                    }
                }

                if (label) runs->label = label;
                else runs->label = LabelsSolver::NewLabel();
                runs->start_pos = start_pos;
                runs->end_pos = end_pos;
            }
        out2:
            runs_up = runs_save;
        }
        n_labels_ = LabelsSolver::Flatten();
    }